

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O2

LY_ERR lys_compile_type_(lysc_ctx *ctx,lysp_node *context_pnode,uint16_t context_flags,
                        char *context_name,lysp_type *type_p,LY_DATA_TYPE basetype,char *tpdfname,
                        lysc_type *base,lyplg_type *plugin,ly_set *tpdf_chain,
                        uint32_t tpdf_chain_last,lysc_type **type)

{
  int *piVar1;
  void **ppvVar2;
  lysc_type **type_00;
  lysp_type *plVar3;
  long lVar4;
  lysc_type *plVar5;
  lyd_node *plVar6;
  lysp_ext_instance *plVar7;
  LY_VECODE LVar8;
  LY_DATA_TYPE LVar9;
  uint8_t frdigits;
  LY_ERR LVar10;
  lysc_type *plVar11;
  ulong uVar12;
  ulong uVar13;
  LY_DATA_TYPE *pLVar14;
  long *plVar15;
  long lVar16;
  lysp_ext_instance *plVar17;
  lysp_ext_instance *plVar18;
  lysc_ext_instance *plVar19;
  long *plVar20;
  char *pcVar21;
  lysc_type_bitenum_item *base_enums;
  size_t sVar22;
  lysp_type_enum *plVar23;
  lyxp_expr *exp;
  lysp_restr *plVar24;
  ly_ctx *plVar25;
  lysc_ext_instance **range;
  lysc_range *plVar26;
  char *pcVar27;
  long lVar28;
  lysp_restr **pplVar29;
  void *pvVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  size_t sStackY_a0;
  long local_40;
  LY_VALUE_FORMAT format;
  
  plVar25 = ctx->ctx;
  *type = (lysc_type *)0x0;
  switch(basetype - LY_TYPE_BINARY) {
  case LY_TYPE_UNKNOWN:
  case LY_TYPE_BINARY:
  case LY_TYPE_UINT8:
  case LY_TYPE_UINT16:
  case LY_TYPE_UINT32:
  case LY_TYPE_STRING:
  case LY_TYPE_EMPTY:
  case LY_TYPE_ENUM:
  case LY_TYPE_IDENT:
  case LY_TYPE_LEAFREF:
  case LY_TYPE_UNION:
  case LY_TYPE_INT8:
  case LY_TYPE_INT16:
  case LY_TYPE_INT32:
    sStackY_a0 = 0x28;
    break;
  case LY_TYPE_UINT64:
  case LY_TYPE_BOOL:
    sStackY_a0 = 0x30;
    break;
  case LY_TYPE_BITS:
  case LY_TYPE_DEC64:
    sStackY_a0 = 0x20;
    break;
  case LY_TYPE_INST:
    sStackY_a0 = 0x40;
    break;
  default:
    goto switchD_00144704_default;
  }
  plVar11 = (lysc_type *)calloc(1,sStackY_a0);
  if (plVar11 == (lysc_type *)0x0) {
switchD_00144704_default:
    LVar10 = LY_EMEM;
    ly_log(plVar25,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
    plVar11 = (lysc_type *)0x0;
LAB_00144775:
    free(plVar11);
    goto LAB_00144785;
  }
  if ((tpdfname != (char *)0x0) &&
     (LVar10 = lydict_insert(plVar25,tpdfname,0,(char **)plVar11), LVar10 != LY_SUCCESS))
  goto LAB_00144775;
  *type = plVar11;
  plVar11->basetype = basetype;
  plVar11->plugin = plugin;
  uVar12 = (ulong)tpdf_chain_last;
  switch(basetype - LY_TYPE_BINARY) {
  case LY_TYPE_UNKNOWN:
    if (type_p->length == (lysp_restr *)0x0) break;
    if (base == (lysc_type *)0x0) {
      plVar26 = (lysc_range *)0x0;
    }
    else {
      plVar26 = (lysc_range *)base[1].name;
    }
    plVar11 = plVar11 + 1;
    LVar10 = lys_compile_type_range
                       (ctx,type_p->length,LY_TYPE_BINARY,'\x01','\0',plVar26,(lysc_range **)plVar11
                       );
    if (LVar10 != LY_SUCCESS) goto LAB_00144785;
    if ((tpdfname != (char *)0x0) ||
       (plVar17 = type_p->length->exts, plVar17 == (lysp_ext_instance *)0x0)) break;
    plVar26 = (lysc_range *)plVar11->name;
    plVar19 = plVar26->exts;
    if (plVar19 == (lysc_ext_instance *)0x0) {
      plVar20 = (long *)calloc(1,(long)plVar17[-1].exts * 0x48 + 8);
      if (plVar20 == (long *)0x0) goto LAB_00145d3e;
      pvVar30 = (void *)0x0;
LAB_00145c9f:
      plVar26->exts = (lysc_ext_instance *)(plVar20 + 1);
      plVar19 = ((lysc_range *)plVar11->name)->exts;
      if (plVar19 != (lysc_ext_instance *)0x0) {
        plVar17 = type_p->length->exts;
        if (plVar17 == (lysp_ext_instance *)0x0) {
          plVar17 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar17 = plVar17[-1].exts;
        }
        memset(plVar19 + *plVar20,0,((long)&plVar17->name + (long)pvVar30) * 0x48);
      }
      lVar28 = 0;
      plVar17 = (lysp_ext_instance *)0x0;
      while( true ) {
        plVar7 = type_p->length->exts;
        if (plVar7 == (lysp_ext_instance *)0x0) {
          plVar18 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar18 = plVar7[-1].exts;
        }
        if (plVar18 <= plVar17) break;
        plVar26 = (lysc_range *)plVar11->name;
        plVar19 = plVar26->exts;
        pvVar30 = plVar19[-1].compiled;
        plVar19[-1].compiled = (void *)((long)pvVar30 + 1);
        LVar10 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar7->name + lVar28),
                                 plVar19 + (long)pvVar30,plVar26);
        if (LVar10 != LY_SUCCESS) {
          if (LVar10 != LY_ENOT) goto LAB_00144785;
          ppvVar2 = &((lysc_range *)plVar11->name)->exts[-1].compiled;
          *ppvVar2 = (void *)((long)*ppvVar2 + -1);
        }
        plVar17 = (lysp_ext_instance *)((long)&plVar17->name + 1);
        lVar28 = lVar28 + 0x70;
      }
      break;
    }
    pvVar30 = plVar19[-1].compiled;
    plVar20 = (long *)realloc(&plVar19[-1].compiled,
                              ((long)&(plVar17[-1].exts)->name + (long)pvVar30 * 2) * 0x48 + 8);
    if (plVar20 != (long *)0x0) {
      plVar26 = (lysc_range *)plVar11->name;
      goto LAB_00145c9f;
    }
LAB_001458c5:
    plVar25 = ctx->ctx;
    goto LAB_00145d52;
  case LY_TYPE_BINARY:
  case LY_TYPE_UINT8:
  case LY_TYPE_UINT16:
  case LY_TYPE_UINT32:
  case LY_TYPE_UNION:
  case LY_TYPE_INT8:
  case LY_TYPE_INT16:
  case LY_TYPE_INT32:
    if (type_p->range != (lysp_restr *)0x0) {
      if (base == (lysc_type *)0x0) {
        plVar26 = (lysc_range *)0x0;
      }
      else {
        plVar26 = (lysc_range *)base[1].name;
      }
      plVar11 = plVar11 + 1;
      LVar10 = lys_compile_type_range
                         (ctx,type_p->range,basetype,'\0','\0',plVar26,(lysc_range **)plVar11);
      if (LVar10 != LY_SUCCESS) goto LAB_00144785;
      if ((tpdfname == (char *)0x0) &&
         (plVar17 = type_p->range->exts, plVar17 != (lysp_ext_instance *)0x0)) {
        plVar26 = (lysc_range *)plVar11->name;
        plVar19 = plVar26->exts;
        if (plVar19 == (lysc_ext_instance *)0x0) {
          plVar20 = (long *)calloc(1,(long)plVar17[-1].exts * 0x48 + 8);
          if (plVar20 != (long *)0x0) {
            pvVar30 = (void *)0x0;
            goto LAB_0014516c;
          }
        }
        else {
          pvVar30 = plVar19[-1].compiled;
          plVar20 = (long *)realloc(&plVar19[-1].compiled,
                                    ((long)&(plVar17[-1].exts)->name + (long)pvVar30 * 2) * 0x48 + 8
                                   );
          if (plVar20 != (long *)0x0) {
            plVar26 = (lysc_range *)plVar11->name;
LAB_0014516c:
            plVar26->exts = (lysc_ext_instance *)(plVar20 + 1);
            plVar19 = ((lysc_range *)plVar11->name)->exts;
            if (plVar19 != (lysc_ext_instance *)0x0) {
              plVar17 = type_p->range->exts;
              if (plVar17 == (lysp_ext_instance *)0x0) {
                plVar17 = (lysp_ext_instance *)0x0;
              }
              else {
                plVar17 = plVar17[-1].exts;
              }
              memset(plVar19 + *plVar20,0,((long)&plVar17->name + (long)pvVar30) * 0x48);
            }
            lVar28 = 0;
            plVar17 = (lysp_ext_instance *)0x0;
            while( true ) {
              plVar7 = type_p->range->exts;
              if (plVar7 == (lysp_ext_instance *)0x0) {
                plVar18 = (lysp_ext_instance *)0x0;
              }
              else {
                plVar18 = plVar7[-1].exts;
              }
              if (plVar18 <= plVar17) break;
              plVar26 = (lysc_range *)plVar11->name;
              plVar19 = plVar26->exts;
              pvVar30 = plVar19[-1].compiled;
              plVar19[-1].compiled = (void *)((long)pvVar30 + 1);
              LVar10 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar7->name + lVar28),
                                       plVar19 + (long)pvVar30,plVar26);
              if (LVar10 != LY_SUCCESS) {
                if (LVar10 != LY_ENOT) goto LAB_00144785;
                ppvVar2 = &((lysc_range *)plVar11->name)->exts[-1].compiled;
                *ppvVar2 = (void *)((long)*ppvVar2 + -1);
              }
              plVar17 = (lysp_ext_instance *)((long)&plVar17->name + 1);
              lVar28 = lVar28 + 0x70;
            }
            break;
          }
        }
        goto LAB_00145d3e;
      }
    }
    break;
  case LY_TYPE_UINT64:
    if (type_p->length == (lysp_restr *)0x0) {
      if (base != (lysc_type *)0x0) {
        pcVar21 = base[1].name;
        if (pcVar21 == (char *)0x0) goto LAB_00145914;
        pcVar27 = (char *)calloc(1,0x30);
        if (pcVar27 == (char *)0x0) {
          pcVar27 = (char *)0x0;
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysc_range_dup");
        }
        else {
          pvVar30 = *(void **)pcVar21;
          if (pvVar30 == (void *)0x0) {
LAB_00144b82:
            LVar10 = lydict_dup(ctx->ctx,*(char **)(pcVar21 + 0x20),(char **)(pcVar27 + 0x20));
            if ((LVar10 == LY_SUCCESS) &&
               (LVar10 = lydict_dup(ctx->ctx,*(char **)(pcVar21 + 0x18),(char **)(pcVar27 + 0x18)),
               LVar10 == LY_SUCCESS)) {
              uVar33 = (ulong)tpdf_chain->count;
              if (tpdf_chain_last < tpdf_chain->count) {
                do {
                  plVar6 = (tpdf_chain->field_2).dnodes[uVar33 - 1];
                  if ((*(long *)(*(long *)plVar6 + 0x48) != 0) &&
                     (lVar28 = *(long *)(*(long *)(*(long *)plVar6 + 0x48) + 0x38), lVar28 != 0)) {
                    lVar16 = *(long *)(pcVar27 + 0x28);
                    if (lVar16 == 0) {
                      plVar20 = (long *)calloc(1,*(long *)(lVar28 + -8) * 0x48 + 8);
                      if (plVar20 == (long *)0x0) goto LAB_001458db;
                      lVar28 = 0;
                      lVar32 = 0;
                    }
                    else {
                      lVar32 = *(long *)(lVar16 + -8);
                      plVar20 = (long *)realloc((void *)(lVar16 + -8),
                                                (lVar32 * 2 + *(long *)(lVar28 + -8)) * 0x48 + 8);
                      if (plVar20 == (long *)0x0) goto LAB_001458db;
                      lVar28 = *plVar20;
                    }
                    *(long **)(pcVar27 + 0x28) = plVar20 + 1;
                    lVar16 = *(long *)(*(long *)(*(long *)plVar6 + 0x48) + 0x38);
                    if (lVar16 == 0) {
                      lVar16 = 0;
                    }
                    else {
                      lVar16 = *(long *)(lVar16 + -8);
                    }
                    memset(plVar20 + lVar28 * 9 + 1,0,(lVar16 + lVar32) * 0x48);
                    lVar28 = 0;
                    uVar31 = 0;
                    while( true ) {
                      lVar16 = *(long *)(*(long *)(*(long *)plVar6 + 0x48) + 0x38);
                      if (lVar16 == 0) {
                        uVar13 = 0;
                      }
                      else {
                        uVar13 = *(ulong *)(lVar16 + -8);
                      }
                      if (uVar13 <= uVar31) break;
                      lVar32 = *(long *)(pcVar27 + 0x28);
                      lVar4 = *(long *)(lVar32 + -8);
                      *(long *)(lVar32 + -8) = lVar4 + 1;
                      LVar10 = lys_compile_ext(ctx,(lysp_ext_instance *)(lVar16 + lVar28),
                                               (lysc_ext_instance *)(lVar4 * 0x48 + lVar32),pcVar27)
                      ;
                      if (LVar10 != LY_SUCCESS) {
                        if (LVar10 != LY_ENOT) goto LAB_001458f8;
                        *(long *)(*(long *)(pcVar27 + 0x28) + -8) =
                             *(long *)(*(long *)(pcVar27 + 0x28) + -8) + -1;
                      }
                      uVar31 = uVar31 + 1;
                      lVar28 = lVar28 + 0x70;
                    }
                  }
                  uVar33 = uVar33 - 1;
                } while (uVar12 < uVar33);
              }
              goto LAB_00145903;
            }
          }
          else {
            plVar20 = (long *)calloc(1,*(long *)((long)pvVar30 + -8) << 4 | 8);
            if (plVar20 != (long *)0x0) {
              *(long **)pcVar27 = plVar20 + 1;
              lVar28 = *(long *)((long)pvVar30 + -8);
              *plVar20 = lVar28;
              memcpy(plVar20 + 1,pvVar30,lVar28 << 4);
              goto LAB_00144b82;
            }
LAB_001458db:
            ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysc_range_dup");
          }
LAB_001458f8:
          free(pcVar27);
          pcVar27 = (char *)0x0;
        }
LAB_00145903:
        plVar11[1].name = pcVar27;
        goto LAB_00145914;
      }
      plVar24 = type_p->patterns;
      if (plVar24 == (lysp_restr *)0x0) break;
LAB_0014592d:
      plVar19 = (lysc_ext_instance *)0x0;
    }
    else {
      if (base == (lysc_type *)0x0) {
        plVar26 = (lysc_range *)0x0;
      }
      else {
        plVar26 = (lysc_range *)base[1].name;
      }
      plVar5 = plVar11 + 1;
      LVar10 = lys_compile_type_range
                         (ctx,type_p->length,LY_TYPE_STRING,'\x01','\0',plVar26,
                          (lysc_range **)plVar5);
      if (LVar10 != LY_SUCCESS) goto LAB_00144785;
      if ((tpdfname == (char *)0x0) &&
         (plVar17 = type_p->length->exts, plVar17 != (lysp_ext_instance *)0x0)) {
        plVar26 = (lysc_range *)plVar5->name;
        plVar19 = plVar26->exts;
        if (plVar19 == (lysc_ext_instance *)0x0) {
          plVar20 = (long *)calloc(1,(long)plVar17[-1].exts * 0x48 + 8);
          if (plVar20 == (long *)0x0) goto LAB_00145d3e;
          pvVar30 = (void *)0x0;
        }
        else {
          pvVar30 = plVar19[-1].compiled;
          plVar20 = (long *)realloc(&plVar19[-1].compiled,
                                    ((long)&(plVar17[-1].exts)->name + (long)pvVar30 * 2) * 0x48 + 8
                                   );
          if (plVar20 == (long *)0x0) goto LAB_001458c5;
          plVar26 = (lysc_range *)plVar5->name;
        }
        plVar26->exts = (lysc_ext_instance *)(plVar20 + 1);
        plVar19 = ((lysc_range *)plVar5->name)->exts;
        if (plVar19 != (lysc_ext_instance *)0x0) {
          plVar17 = type_p->length->exts;
          if (plVar17 == (lysp_ext_instance *)0x0) {
            plVar17 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar17 = plVar17[-1].exts;
          }
          memset(plVar19 + *plVar20,0,((long)&plVar17->name + (long)pvVar30) * 0x48);
        }
        lVar28 = 0;
        plVar17 = (lysp_ext_instance *)0x0;
        while( true ) {
          plVar7 = type_p->length->exts;
          if (plVar7 == (lysp_ext_instance *)0x0) {
            plVar18 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar18 = plVar7[-1].exts;
          }
          if (plVar18 <= plVar17) break;
          plVar26 = (lysc_range *)plVar5->name;
          plVar19 = plVar26->exts;
          pvVar30 = plVar19[-1].compiled;
          plVar19[-1].compiled = (void *)((long)pvVar30 + 1);
          LVar10 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar7->name + lVar28),
                                   plVar19 + (long)pvVar30,plVar26);
          if (LVar10 != LY_SUCCESS) {
            if (LVar10 != LY_ENOT) goto LAB_00144785;
            ppvVar2 = &((lysc_range *)plVar5->name)->exts[-1].compiled;
            *ppvVar2 = (void *)((long)*ppvVar2 + -1);
          }
          plVar17 = (lysp_ext_instance *)((long)&plVar17->name + 1);
          lVar28 = lVar28 + 0x70;
        }
      }
LAB_00145914:
      plVar24 = type_p->patterns;
      if (plVar24 == (lysp_restr *)0x0) {
        if ((base != (lysc_type *)0x0) && (base[1].exts != (lysc_ext_instance *)0x0)) {
          plVar19 = (lysc_ext_instance *)lysc_patterns_dup(ctx->ctx,(lysc_pattern **)base[1].exts);
          plVar11[1].exts = plVar19;
        }
        break;
      }
      if (base == (lysc_type *)0x0) goto LAB_0014592d;
      plVar19 = base[1].exts;
    }
    LVar10 = lys_compile_type_patterns
                       (ctx,plVar24,(lysc_pattern **)plVar19,(lysc_pattern ***)&plVar11[1].exts);
    goto joined_r0x001450c3;
  case LY_TYPE_STRING:
    plVar23 = type_p->bits;
    if (plVar23 == (lysp_type_enum *)0x0) {
      if (base != (lysc_type *)0x0) {
        uVar33 = (ulong)tpdf_chain->count;
        if (tpdf_chain->count <= tpdf_chain_last) {
          __assert_fail("tpdf_chain->count > tpdf_chain_last",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                        ,0x71e,
                        "LY_ERR lys_compile_type_(struct lysc_ctx *, struct lysp_node *, uint16_t, const char *, const struct lysp_type *, LY_DATA_TYPE, const char *, const struct lysc_type *, struct lyplg_type *, struct ly_set *, uint32_t, struct lysc_type **)"
                       );
        }
        while (plVar23 = *(lysp_type_enum **)
                          (*(long *)(tpdf_chain->field_2).dnodes[uVar33 - 1] + 0x68),
              plVar23 == (lysp_type_enum *)0x0) {
          uVar33 = uVar33 - 1;
          if (uVar33 <= uVar12) {
            __assert_fail("base_type_p",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                          ,0x72a,
                          "LY_ERR lys_compile_type_(struct lysc_ctx *, struct lysp_node *, uint16_t, const char *, const struct lysp_type *, LY_DATA_TYPE, const char *, const struct lysc_type *, struct lyplg_type *, struct ly_set *, uint32_t, struct lysc_type **)"
                         );
          }
        }
        LVar9 = LY_TYPE_BITS;
        goto LAB_001450ae;
      }
      plVar25 = ctx->ctx;
      if (tpdfname == (char *)0x0) {
        tpdfname = "";
        pcVar21 = "bit";
        pcVar27 = "bits type";
      }
      else {
        pcVar21 = "bit";
        pcVar27 = "bits type ";
      }
LAB_00145731:
      ly_vlog(plVar25,(char *)0x0,LYVE_SYNTAX_YANG,"Missing %s substatement for %s%s.",pcVar21,
              pcVar27,tpdfname);
LAB_0014573d:
      LVar10 = LY_EVALID;
      goto LAB_00144785;
    }
    if (base == (lysc_type *)0x0) {
      base_enums = (lysc_type_bitenum_item *)0x0;
    }
    else {
      base_enums = (lysc_type_bitenum_item *)base[1].name;
    }
    LVar9 = LY_TYPE_BITS;
LAB_0014502e:
    LVar10 = lys_compile_type_enums
                       (ctx,plVar23,LVar9,base_enums,(lysc_type_bitenum_item **)(plVar11 + 1));
    goto joined_r0x001450c3;
  case LY_TYPE_BOOL:
    frdigits = type_p->fraction_digits;
    if (base == (lysc_type *)0x0) {
      if (frdigits == '\0') {
        plVar25 = ctx->ctx;
        if (tpdfname == (char *)0x0) {
          tpdfname = "";
          pcVar21 = "fraction-digits";
          pcVar27 = "decimal64 type";
        }
        else {
          pcVar21 = "fraction-digits";
          pcVar27 = "decimal64 type ";
        }
        goto LAB_00145731;
      }
      *(uint8_t *)&plVar11[1].name = frdigits;
      plVar24 = type_p->range;
      if (plVar24 != (lysp_restr *)0x0) {
        plVar19 = (lysc_ext_instance *)0x0;
        goto LAB_00144e6b;
      }
    }
    else {
      if (frdigits != '\0') {
        plVar25 = ctx->ctx;
        if (tpdfname != (char *)0x0) {
          pcVar21 = 
          "Invalid fraction-digits substatement for type \"%s\" not directly derived from decimal64 built-in type."
          ;
          goto LAB_00144a37;
        }
        pcVar21 = 
        "Invalid fraction-digits substatement for type not directly derived from decimal64 built-in type."
        ;
LAB_001451f1:
        LVar8 = LYVE_SYNTAX_YANG;
LAB_001451f3:
        ly_vlog(plVar25,(char *)0x0,LVar8,pcVar21);
        goto LAB_0014573d;
      }
      frdigits = *(uint8_t *)&base[1].name;
      *(uint8_t *)&plVar11[1].name = frdigits;
      plVar24 = type_p->range;
      if (plVar24 != (lysp_restr *)0x0) {
        plVar19 = base[1].exts;
LAB_00144e6b:
        pplVar29 = &type_p->range;
        range = &plVar11[1].exts;
        LVar10 = lys_compile_type_range
                           (ctx,plVar24,LY_TYPE_DEC64,'\0',frdigits,(lysc_range *)plVar19,
                            (lysc_range **)range);
        if (LVar10 != LY_SUCCESS) goto LAB_00144785;
        if ((tpdfname == (char *)0x0) &&
           (plVar17 = (*pplVar29)->exts, plVar17 != (lysp_ext_instance *)0x0)) {
          plVar19 = *range;
          lVar28 = *(long *)&plVar19->parent_stmt;
          if (lVar28 == 0) {
            plVar20 = (long *)calloc(1,(long)plVar17[-1].exts * 0x48 + 8);
            if (plVar20 != (long *)0x0) {
              lVar16 = 0;
              goto LAB_00145cfd;
            }
          }
          else {
            lVar16 = *(long *)(lVar28 + -8);
            plVar20 = (long *)realloc((void *)(lVar28 + -8),
                                      ((long)&(plVar17[-1].exts)->name + lVar16 * 2) * 0x48 + 8);
            if (plVar20 != (long *)0x0) {
              plVar19 = *range;
LAB_00145cfd:
              *(long **)&plVar19->parent_stmt = plVar20 + 1;
              if (*(long *)&(*range)->parent_stmt != 0) {
                if ((*pplVar29)->exts == (lysp_ext_instance *)0x0) {
                  plVar17 = (lysp_ext_instance *)0x0;
                }
                else {
                  plVar17 = (*pplVar29)->exts[-1].exts;
                }
                memset((void *)(*(long *)&(*range)->parent_stmt + *plVar20 * 0x48),0,
                       ((long)&plVar17->name + lVar16) * 0x48);
              }
              lVar28 = 0;
              plVar17 = (lysp_ext_instance *)0x0;
              while( true ) {
                plVar7 = (*pplVar29)->exts;
                if (plVar7 == (lysp_ext_instance *)0x0) {
                  plVar18 = (lysp_ext_instance *)0x0;
                }
                else {
                  plVar18 = plVar7[-1].exts;
                }
                if (plVar18 <= plVar17) break;
                plVar19 = *range;
                lVar16 = *(long *)&plVar19->parent_stmt;
                lVar32 = *(long *)(lVar16 + -8);
                *(long *)(lVar16 + -8) = lVar32 + 1;
                LVar10 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar7->name + lVar28),
                                         (lysc_ext_instance *)(lVar16 + lVar32 * 0x48),plVar19);
                if (LVar10 != LY_SUCCESS) {
                  if (LVar10 != LY_ENOT) goto LAB_00144785;
                  lVar16 = *(long *)&(*range)->parent_stmt + -8;
                  *(long *)lVar16 = *(long *)lVar16 + -1;
                }
                plVar17 = (lysp_ext_instance *)((long)&plVar17->name + 1);
                lVar28 = lVar28 + 0x70;
              }
              break;
            }
          }
          goto LAB_00145d3e;
        }
      }
    }
    break;
  case LY_TYPE_EMPTY:
    plVar23 = type_p->enums;
    if (plVar23 != (lysp_type_enum *)0x0) {
      if (base == (lysc_type *)0x0) {
        base_enums = (lysc_type_bitenum_item *)0x0;
      }
      else {
        base_enums = (lysc_type_bitenum_item *)base[1].name;
      }
      LVar9 = LY_TYPE_ENUM;
      goto LAB_0014502e;
    }
    if (base == (lysc_type *)0x0) {
      plVar25 = ctx->ctx;
      if (tpdfname == (char *)0x0) {
        tpdfname = "";
        pcVar21 = "enum";
        pcVar27 = "enumeration type";
      }
      else {
        pcVar21 = "enum";
        pcVar27 = "enumeration type ";
      }
      goto LAB_00145731;
    }
    uVar33 = (ulong)tpdf_chain->count;
    if (tpdf_chain->count <= tpdf_chain_last) {
      __assert_fail("tpdf_chain->count > tpdf_chain_last",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                    ,0x781,
                    "LY_ERR lys_compile_type_(struct lysc_ctx *, struct lysp_node *, uint16_t, const char *, const struct lysp_type *, LY_DATA_TYPE, const char *, const struct lysc_type *, struct lyplg_type *, struct ly_set *, uint32_t, struct lysc_type **)"
                   );
    }
    while (plVar23 = *(lysp_type_enum **)(*(long *)(tpdf_chain->field_2).dnodes[uVar33 - 1] + 0x60),
          plVar23 == (lysp_type_enum *)0x0) {
      uVar33 = uVar33 - 1;
      if (uVar33 <= uVar12) {
        __assert_fail("base_type_p",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                      ,0x78d,
                      "LY_ERR lys_compile_type_(struct lysc_ctx *, struct lysp_node *, uint16_t, const char *, const struct lysp_type *, LY_DATA_TYPE, const char *, const struct lysc_type *, struct lyplg_type *, struct ly_set *, uint32_t, struct lysc_type **)"
                     );
      }
    }
    LVar9 = LY_TYPE_ENUM;
LAB_001450ae:
    LVar10 = lys_compile_type_enums
                       (ctx,plVar23,LVar9,(lysc_type_bitenum_item *)0x0,
                        (lysc_type_bitenum_item **)(plVar11 + 1));
joined_r0x001450c3:
    if (LVar10 != LY_SUCCESS) goto LAB_00144785;
    break;
  case LY_TYPE_ENUM:
    if (type_p->bases != (char **)0x0) {
      if (base != (lysc_type *)0x0) {
        plVar25 = ctx->ctx;
        if (tpdfname == (char *)0x0) {
          pcVar21 = 
          "Invalid base substatement for the type not directly derived from identityref built-in type."
          ;
          goto LAB_001451f1;
        }
        pcVar21 = 
        "Invalid base substatement for the type \"%s\" not directly derived from identityref built-in type."
        ;
LAB_00144a37:
        LVar8 = LYVE_SYNTAX_YANG;
LAB_00144a39:
        ly_vlog(plVar25,(char *)0x0,LVar8,pcVar21,tpdfname);
        goto LAB_0014573d;
      }
      LVar10 = lys_compile_identity_bases
                         (ctx,type_p->pmod,type_p->bases,(lysc_ident *)0x0,
                          (lysc_ident ***)(plVar11 + 1));
      goto joined_r0x001450c3;
    }
    if (base == (lysc_type *)0x0) {
      plVar25 = ctx->ctx;
      if (tpdfname == (char *)0x0) {
        tpdfname = "";
        pcVar21 = "base";
        pcVar27 = "identityref type";
      }
      else {
        pcVar21 = "base";
        pcVar27 = "identityref type ";
      }
      goto LAB_00145731;
    }
    pcVar21 = plVar11[1].name;
    if (pcVar21 == (char *)0x0) {
      pcVar21 = base[1].name;
      if (pcVar21 == (char *)0x0) {
        sVar22 = 8;
      }
      else {
        sVar22 = *(long *)(pcVar21 + -8) * 8 + 8;
      }
      plVar20 = (long *)calloc(1,sVar22);
      if (plVar20 != (long *)0x0) {
        lVar28 = 0;
        goto LAB_00145815;
      }
    }
    else {
      if (base[1].name == (char *)0x0) {
        lVar28 = 0;
      }
      else {
        lVar28 = *(long *)(base[1].name + -8);
      }
      plVar20 = (long *)realloc(pcVar21 + -8,(lVar28 + *(long *)(pcVar21 + -8)) * 8 + 8);
      if (plVar20 != (long *)0x0) {
        lVar28 = *plVar20;
        pcVar21 = base[1].name;
LAB_00145815:
        plVar15 = plVar20 + 1;
        plVar11[1].name = (char *)plVar15;
        if (pcVar21 == (char *)0x0) {
          sVar22 = 0;
        }
        else {
          sVar22 = *(long *)(pcVar21 + -8) << 3;
        }
        uVar33 = 0;
        memset(plVar20 + lVar28 + 1,0,sVar22);
        while( true ) {
          if (pcVar21 == (char *)0x0) {
            uVar31 = 0;
          }
          else {
            uVar31 = *(ulong *)(pcVar21 + -8);
          }
          if (uVar31 <= uVar33) break;
          plVar15[uVar33] = *(long *)(pcVar21 + uVar33 * 8);
          plVar15 = (long *)plVar11[1].name;
          plVar15[-1] = plVar15[-1] + 1;
          uVar33 = uVar33 + 1;
          pcVar21 = base[1].name;
        }
        break;
      }
    }
    goto LAB_00145d3e;
  case LY_TYPE_IDENT:
    if ((type_p->flags & 0x200) == 0) {
      *(undefined1 *)&plVar11[1].name = 1;
    }
    else {
      *(uint8_t *)&plVar11[1].name = type_p->require_instance;
    }
    break;
  case LY_TYPE_INST:
    if ((type_p->flags & 0x200) == 0) {
      if (base != (lysc_type *)0x0) {
        pLVar14 = &base[1].basetype;
        goto LAB_00144de3;
      }
      *(undefined1 *)&plVar11[1].basetype = LY_TYPE_BINARY;
      exp = type_p->path;
      if (exp == (lyxp_expr *)0x0) goto LAB_001451ae;
    }
    else {
      if (type_p->pmod->version < 2) {
        plVar25 = ctx->ctx;
        if (tpdfname == (char *)0x0) {
          pcVar21 = 
          "Leafref type can be restricted by require-instance statement only in YANG 1.1 modules.";
          LVar8 = LYVE_SEMANTICS;
          goto LAB_001451f3;
        }
        pcVar21 = 
        "Leafref type \"%s\" can be restricted by require-instance statement only in YANG 1.1 modules."
        ;
        LVar8 = LYVE_SEMANTICS;
        goto LAB_00144a39;
      }
      pLVar14 = (LY_DATA_TYPE *)&type_p->require_instance;
LAB_00144de3:
      *(char *)&plVar11[1].basetype = (char)*pLVar14;
      exp = type_p->path;
      if (exp == (lyxp_expr *)0x0) {
        if (base == (lysc_type *)0x0) {
LAB_001451ae:
          plVar25 = ctx->ctx;
          if (tpdfname == (char *)0x0) {
            tpdfname = "";
            pcVar21 = "path";
            pcVar27 = "leafref type";
          }
          else {
            pcVar21 = "path";
            pcVar27 = "leafref type ";
          }
          goto LAB_00145731;
        }
        LVar10 = lyxp_expr_dup(ctx->ctx,(lyxp_expr *)base[1].name,0,0,(lyxp_expr **)(plVar11 + 1));
        if (LVar10 != LY_SUCCESS) goto LAB_00144785;
        LVar10 = lyplg_type_prefix_data_dup
                           (ctx->ctx,LY_VALUE_SCHEMA_RESOLVED,base[1].exts,&plVar11[1].exts);
        goto joined_r0x001450c3;
      }
    }
    LVar10 = lyxp_expr_dup(ctx->ctx,exp,0,0,(lyxp_expr **)(plVar11 + 1));
    if (LVar10 != LY_SUCCESS) goto LAB_00144785;
    plVar25 = ctx->ctx;
    pcVar21 = type_p->path->expr;
    sVar22 = strlen(pcVar21);
    LVar10 = lyplg_type_prefix_data_new
                       (plVar25,pcVar21,sVar22,LY_VALUE_SCHEMA,type_p->pmod,&format,&plVar11[1].exts
                       );
    if (LVar10 != LY_SUCCESS) {
      return LY_SUCCESS;
    }
    break;
  case LY_TYPE_LEAFREF:
    plVar3 = type_p->types;
    if (plVar3 == (lysp_type *)0x0) {
      if (base == (lysc_type *)0x0) {
        plVar25 = ctx->ctx;
        if (tpdfname == (char *)0x0) {
          tpdfname = "";
          pcVar21 = "type";
          pcVar27 = "union type";
        }
        else {
          pcVar21 = "type";
          pcVar27 = "union type ";
        }
        goto LAB_00145731;
      }
      pcVar21 = plVar11[1].name;
      if (pcVar21 == (char *)0x0) {
        pcVar21 = base[1].name;
        if (pcVar21 == (char *)0x0) {
          sVar22 = 8;
        }
        else {
          sVar22 = *(long *)(pcVar21 + -8) * 8 + 8;
        }
        plVar20 = (long *)calloc(1,sVar22);
        if (plVar20 != (long *)0x0) {
          lVar28 = 0;
          goto LAB_0014575b;
        }
      }
      else {
        if (base[1].name == (char *)0x0) {
          lVar28 = 0;
        }
        else {
          lVar28 = *(long *)(base[1].name + -8);
        }
        plVar20 = (long *)realloc(pcVar21 + -8,(lVar28 + *(long *)(pcVar21 + -8)) * 8 + 8);
        if (plVar20 != (long *)0x0) {
          lVar28 = *plVar20;
          pcVar21 = base[1].name;
LAB_0014575b:
          plVar15 = plVar20 + 1;
          plVar11[1].name = (char *)plVar15;
          if (pcVar21 == (char *)0x0) {
            sVar22 = 0;
          }
          else {
            sVar22 = *(long *)(pcVar21 + -8) << 3;
          }
          uVar33 = 0;
          memset(plVar20 + lVar28 + 1,0,sVar22);
          while( true ) {
            if (pcVar21 == (char *)0x0) {
              uVar31 = 0;
            }
            else {
              uVar31 = *(ulong *)(pcVar21 + -8);
            }
            if (uVar31 <= uVar33) break;
            plVar15[uVar33] = *(long *)(pcVar21 + uVar33 * 8);
            LOCK();
            piVar1 = (int *)(*(long *)(plVar11[1].name + uVar33 * 8) + 0x1c);
            *piVar1 = *piVar1 + 1;
            UNLOCK();
            plVar15 = (long *)plVar11[1].name;
            plVar15[-1] = plVar15[-1] + 1;
            uVar33 = uVar33 + 1;
            pcVar21 = base[1].name;
          }
          break;
        }
      }
      goto LAB_00145d3e;
    }
    if (base != (lysc_type *)0x0) {
      plVar25 = ctx->ctx;
      if (tpdfname == (char *)0x0) {
        pcVar21 = 
        "Invalid type substatement for the type not directly derived from union built-in type.";
        goto LAB_001451f1;
      }
      pcVar21 = 
      "Invalid type substatement for the type \"%s\" not directly derived from union built-in type."
      ;
      goto LAB_00144a37;
    }
    plVar20 = (long *)plVar11[1].name;
    if (plVar20 == (long *)0x0) {
      lVar28 = *(long *)&plVar3[-1].fraction_digits;
      plVar15 = (long *)calloc(1,lVar28 * 8 + 8);
      if (plVar15 != (long *)0x0) {
        lVar16 = 0;
        goto LAB_0014533e;
      }
      LVar10 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_union");
      plVar20 = (long *)0x0;
    }
    else {
      plVar15 = (long *)realloc(plVar20 + -1,
                                (*(long *)&plVar3[-1].fraction_digits + plVar20[-1]) * 8 + 8);
      if (plVar15 != (long *)0x0) {
        lVar16 = *plVar15;
        lVar28._0_1_ = plVar3[-1].fraction_digits;
        lVar28._1_1_ = plVar3[-1].require_instance;
        lVar28._2_2_ = plVar3[-1].flags;
        lVar28._4_4_ = *(undefined4 *)&plVar3[-1].field_0x64;
LAB_0014533e:
        local_40 = 8;
        plVar20 = plVar15 + 1;
        memset(plVar15 + lVar16 + 1,0,lVar28 << 3);
        lVar28 = 0;
        for (uVar33 = 0; uVar31._0_1_ = plVar3[-1].fraction_digits,
            uVar31._1_1_ = plVar3[-1].require_instance, uVar31._2_2_ = plVar3[-1].flags,
            uVar31._4_4_ = *(undefined4 *)&plVar3[-1].field_0x64, uVar33 < uVar31;
            uVar33 = uVar33 + 1) {
          type_00 = (lysc_type **)(plVar20 + lVar28 + uVar33);
          LVar10 = lys_compile_type(ctx,context_pnode,context_flags,context_name,plVar3 + uVar33,
                                    type_00,(char **)0x0,(lysp_qname **)0x0);
          if (LVar10 != LY_SUCCESS) goto LAB_001458b7;
          LOCK();
          (*type_00)->refcount = (*type_00)->refcount + 1;
          UNLOCK();
          plVar5 = *type_00;
          plVar15 = plVar20 + -1;
          if (plVar5->basetype == LY_TYPE_UNION) {
            if (plVar5[1].name == (char *)0x0) {
              lVar16 = 0;
            }
            else {
              lVar16 = *(long *)(plVar5[1].name + -8);
            }
            plVar15 = (long *)realloc(plVar15,(*(long *)&plVar3[-1].fraction_digits + lVar28 +
                                              lVar16) * 8 + 8);
            if (plVar15 == (long *)0x0) {
              LVar10 = LY_EMEM;
              ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_compile_type_union");
              lysc_type_free(&ctx->free_ctx,plVar5);
              goto LAB_001458b7;
            }
            if (plVar5[1].name == (char *)0x0) {
              lVar16 = 0;
            }
            else {
              lVar16 = *(long *)(plVar5[1].name + -8);
            }
            plVar20 = plVar15 + 1;
            memset(plVar15 + *plVar15 + 1,0,
                   (lVar16 + *(long *)&plVar3[-1].fraction_digits + (lVar28 - *plVar15)) * 8);
            uVar31 = 0;
            while( true ) {
              pcVar21 = plVar5[1].name;
              if (pcVar21 == (char *)0x0) {
                uVar13 = 0;
              }
              else {
                uVar13 = *(ulong *)(pcVar21 + -8);
              }
              if (uVar13 <= uVar31) break;
              *(undefined8 *)((long)plVar15 + uVar31 * 8 + local_40 + lVar28 * 8) =
                   *(undefined8 *)(pcVar21 + uVar31 * 8);
              LOCK();
              piVar1 = (int *)(*(long *)(plVar5[1].name + uVar31 * 8) + 0x1c);
              *piVar1 = *piVar1 + 1;
              UNLOCK();
              *plVar15 = *plVar15 + 1;
              uVar31 = uVar31 + 1;
            }
            lVar28 = lVar28 + uVar31 + -1;
            lysc_type_free(&ctx->free_ctx,plVar5);
          }
          else {
            *plVar15 = *plVar15 + 1;
          }
          local_40 = local_40 + 8;
        }
        plVar11[1].name = (char *)plVar20;
        break;
      }
      LVar10 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_union");
    }
LAB_001458b7:
    plVar11[1].name = (char *)plVar20;
    goto LAB_00144785;
  }
  uVar33 = (ulong)tpdf_chain->count;
  if (tpdf_chain_last < tpdf_chain->count) {
    do {
      plVar6 = (tpdf_chain->field_2).dnodes[uVar33 - 1];
      lVar28 = *(long *)(*(long *)plVar6 + 0x88);
      if (lVar28 != 0) {
        plVar11 = *type;
        plVar19 = plVar11->exts;
        if (plVar19 == (lysc_ext_instance *)0x0) {
          plVar20 = (long *)calloc(1,*(long *)(lVar28 + -8) * 0x48 + 8);
          if (plVar20 == (long *)0x0) goto LAB_00145d3e;
          pvVar30 = (void *)0x0;
        }
        else {
          pvVar30 = plVar19[-1].compiled;
          plVar20 = (long *)realloc(&plVar19[-1].compiled,
                                    ((long)pvVar30 * 2 + *(long *)(lVar28 + -8)) * 0x48 + 8);
          if (plVar20 == (long *)0x0) goto LAB_00145d3e;
          plVar11 = *type;
        }
        plVar11->exts = (lysc_ext_instance *)(plVar20 + 1);
        if ((*type)->exts != (lysc_ext_instance *)0x0) {
          if (*(long *)(*(long *)plVar6 + 0x88) == 0) {
            lVar28 = 0;
          }
          else {
            lVar28 = *(long *)(*(long *)(*(long *)plVar6 + 0x88) + -8);
          }
          memset((*type)->exts + *plVar20,0,(lVar28 + (long)pvVar30) * 0x48);
        }
        lVar28 = 0;
        uVar31 = 0;
        while( true ) {
          lVar16 = *(long *)(*(long *)plVar6 + 0x88);
          if (lVar16 == 0) {
            uVar13 = 0;
          }
          else {
            uVar13 = *(ulong *)(lVar16 + -8);
          }
          if (uVar13 <= uVar31) break;
          plVar11 = *type;
          plVar19 = plVar11->exts;
          pvVar30 = plVar19[-1].compiled;
          plVar19[-1].compiled = (void *)((long)pvVar30 + 1);
          LVar10 = lys_compile_ext(ctx,(lysp_ext_instance *)(lVar16 + lVar28),
                                   plVar19 + (long)pvVar30,plVar11);
          if (LVar10 != LY_SUCCESS) {
            if (LVar10 != LY_ENOT) goto LAB_00144785;
            ppvVar2 = &(*type)->exts[-1].compiled;
            *ppvVar2 = (void *)((long)*ppvVar2 + -1);
          }
          uVar31 = uVar31 + 1;
          lVar28 = lVar28 + 0x70;
        }
      }
      uVar33 = uVar33 - 1;
    } while (uVar12 < uVar33);
  }
  plVar17 = type_p->exts;
  if (plVar17 == (lysp_ext_instance *)0x0) {
    return LY_SUCCESS;
  }
  plVar11 = *type;
  plVar19 = plVar11->exts;
  if (plVar19 == (lysc_ext_instance *)0x0) {
    plVar20 = (long *)calloc(1,(long)plVar17[-1].exts * 0x48 + 8);
    if (plVar20 != (long *)0x0) {
      pvVar30 = (void *)0x0;
      goto LAB_00145b5a;
    }
  }
  else {
    pvVar30 = plVar19[-1].compiled;
    plVar20 = (long *)realloc(&plVar19[-1].compiled,
                              ((long)&(plVar17[-1].exts)->name + (long)pvVar30 * 2) * 0x48 + 8);
    if (plVar20 != (long *)0x0) {
      plVar11 = *type;
LAB_00145b5a:
      plVar11->exts = (lysc_ext_instance *)(plVar20 + 1);
      if ((*type)->exts != (lysc_ext_instance *)0x0) {
        if (type_p->exts == (lysp_ext_instance *)0x0) {
          plVar17 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar17 = type_p->exts[-1].exts;
        }
        memset((*type)->exts + *plVar20,0,((long)&plVar17->name + (long)pvVar30) * 0x48);
      }
      lVar28 = 0;
      plVar17 = (lysp_ext_instance *)0x0;
      do {
        plVar7 = type_p->exts;
        if (plVar7 == (lysp_ext_instance *)0x0) {
          plVar18 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar18 = plVar7[-1].exts;
        }
        if (plVar18 <= plVar17) {
          return LY_SUCCESS;
        }
        plVar11 = *type;
        plVar19 = plVar11->exts;
        pvVar30 = plVar19[-1].compiled;
        plVar19[-1].compiled = (void *)((long)pvVar30 + 1);
        LVar10 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar7->name + lVar28),
                                 plVar19 + (long)pvVar30,plVar11);
        if (LVar10 != LY_SUCCESS) {
          if (LVar10 != LY_ENOT) goto LAB_00144785;
          ppvVar2 = &(*type)->exts[-1].compiled;
          *ppvVar2 = (void *)((long)*ppvVar2 + -1);
        }
        plVar17 = (lysp_ext_instance *)((long)&plVar17->name + 1);
        lVar28 = lVar28 + 0x70;
      } while( true );
    }
  }
LAB_00145d3e:
  plVar25 = ctx->ctx;
LAB_00145d52:
  LVar10 = LY_EMEM;
  ly_log(plVar25,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_");
LAB_00144785:
  LOCK();
  (*type)->refcount = (*type)->refcount + 1;
  UNLOCK();
  lysc_type_free(&ctx->free_ctx,*type);
  *type = (lysc_type *)0x0;
  return LVar10;
}

Assistant:

static LY_ERR
lys_compile_type_(struct lysc_ctx *ctx, struct lysp_node *context_pnode, uint16_t context_flags, const char *context_name,
        const struct lysp_type *type_p, LY_DATA_TYPE basetype, const char *tpdfname, const struct lysc_type *base,
        struct lyplg_type *plugin, struct ly_set *tpdf_chain, uint32_t tpdf_chain_last, struct lysc_type **type)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysc_type_bin *bin;
    struct lysc_type_num *num;
    struct lysc_type_str *str;
    struct lysc_type_bits *bits;
    struct lysc_type_enum *enumeration;
    struct lysc_type_dec *dec;
    struct lysc_type_identityref *idref;
    struct lysc_type_leafref *lref;
    struct lysc_type_union *un;
    struct lys_type_item *tpdf_item;
    const struct lysp_type *base_type_p;
    uint32_t i;

    /* alloc and init */
    rc = lys_new_type(ctx->ctx, basetype, tpdfname, type);
    LY_CHECK_GOTO(rc, cleanup);

    (*type)->basetype = basetype;
    (*type)->plugin = plugin;

    switch (basetype) {
    case LY_TYPE_BINARY:
        bin = (struct lysc_type_bin *)*type;

        /* RFC 7950 9.8.1, 9.4.4 - length, number of octets it contains */
        if (type_p->length) {
            LY_CHECK_GOTO(rc = lys_compile_type_range(ctx, type_p->length, basetype, 1, 0,
                    base ? ((struct lysc_type_bin *)base)->length : NULL, &bin->length), cleanup);
            if (!tpdfname) {
                COMPILE_EXTS_GOTO(ctx, type_p->length->exts, bin->length->exts, bin->length, rc, cleanup);
            }
        }
        break;
    case LY_TYPE_BITS:
        /* RFC 7950 9.7 - bits */
        bits = (struct lysc_type_bits *)*type;
        if (type_p->bits) {
            /* compile bits from this type */
            LY_CHECK_GOTO(rc = lys_compile_type_enums(ctx, type_p->bits, basetype,
                    base ? (struct lysc_type_bitenum_item *)((struct lysc_type_bits *)base)->bits : NULL,
                    (struct lysc_type_bitenum_item **)&bits->bits), cleanup);
        } else if (base) {
            /* recompile bits from the first superior type with bits */
            assert(tpdf_chain->count > tpdf_chain_last);
            base_type_p = NULL;
            i = tpdf_chain->count;
            do {
                --i;
                tpdf_item = tpdf_chain->objs[i];

                if (tpdf_item->tpdf->type.bits) {
                    base_type_p = &tpdf_item->tpdf->type;
                    break;
                }
            } while (i > tpdf_chain_last);
            assert(base_type_p);

            LY_CHECK_GOTO(rc = lys_compile_type_enums(ctx, base_type_p->bits, basetype, NULL,
                    (struct lysc_type_bitenum_item **)&bits->bits), cleanup);
        } else {
            /* type derived from bits built-in type must contain at least one bit */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "bit", "bits type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "bit", "bits type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_DEC64:
        dec = (struct lysc_type_dec *)*type;

        /* RFC 7950 9.3.4 - fraction-digits */
        if (!base) {
            if (!type_p->fraction_digits) {
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "fraction-digits", "decimal64 type ", tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "fraction-digits", "decimal64 type", "");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            dec->fraction_digits = type_p->fraction_digits;
        } else {
            if (type_p->fraction_digits) {
                /* fraction digits is prohibited in types not directly derived from built-in decimal64 */
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid fraction-digits substatement for type \"%s\" not directly derived from decimal64 built-in type.",
                            tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid fraction-digits substatement for type not directly derived from decimal64 built-in type.");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            dec->fraction_digits = ((struct lysc_type_dec *)base)->fraction_digits;
        }

        /* RFC 7950 9.2.4 - range */
        if (type_p->range) {
            LY_CHECK_GOTO(rc = lys_compile_type_range(ctx, type_p->range, basetype, 0, dec->fraction_digits,
                    base ? ((struct lysc_type_dec *)base)->range : NULL, &dec->range), cleanup);
            if (!tpdfname) {
                COMPILE_EXTS_GOTO(ctx, type_p->range->exts, dec->range->exts, dec->range, rc, cleanup);
            }
        }
        break;
    case LY_TYPE_STRING:
        str = (struct lysc_type_str *)*type;

        /* RFC 7950 9.4.4 - length */
        if (type_p->length) {
            LY_CHECK_GOTO(rc = lys_compile_type_range(ctx, type_p->length, basetype, 1, 0,
                    base ? ((struct lysc_type_str *)base)->length : NULL, &str->length), cleanup);
            if (!tpdfname) {
                COMPILE_EXTS_GOTO(ctx, type_p->length->exts, str->length->exts, str->length, rc, cleanup);
            }
        } else if (base && ((struct lysc_type_str *)base)->length) {
            str->length = lysc_range_dup(ctx, ((struct lysc_type_str *)base)->length, tpdf_chain, tpdf_chain_last);
        }

        /* RFC 7950 9.4.5 - pattern */
        if (type_p->patterns) {
            LY_CHECK_GOTO(rc = lys_compile_type_patterns(ctx, type_p->patterns,
                    base ? ((struct lysc_type_str *)base)->patterns : NULL, &str->patterns), cleanup);
        } else if (base && ((struct lysc_type_str *)base)->patterns) {
            str->patterns = lysc_patterns_dup(ctx->ctx, ((struct lysc_type_str *)base)->patterns);
        }
        break;
    case LY_TYPE_ENUM:
        enumeration = (struct lysc_type_enum *)*type;

        /* RFC 7950 9.6 - enum */
        if (type_p->enums) {
            LY_CHECK_GOTO(rc = lys_compile_type_enums(ctx, type_p->enums, basetype,
                    base ? ((struct lysc_type_enum *)base)->enums : NULL, &enumeration->enums), cleanup);
        } else if (base) {
            /* recompile enums from the first superior type with enums */
            assert(tpdf_chain->count > tpdf_chain_last);
            base_type_p = NULL;
            i = tpdf_chain->count;
            do {
                --i;
                tpdf_item = tpdf_chain->objs[i];

                if (tpdf_item->tpdf->type.enums) {
                    base_type_p = &tpdf_item->tpdf->type;
                    break;
                }
            } while (i > tpdf_chain_last);
            assert(base_type_p);

            LY_CHECK_GOTO(rc = lys_compile_type_enums(ctx, base_type_p->enums, basetype, NULL, &enumeration->enums), cleanup);
        } else {
            /* type derived from enumerations built-in type must contain at least one enum */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "enum", "enumeration type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "enum", "enumeration type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_INT8:
    case LY_TYPE_UINT8:
    case LY_TYPE_INT16:
    case LY_TYPE_UINT16:
    case LY_TYPE_INT32:
    case LY_TYPE_UINT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT64:
        num = (struct lysc_type_num *)*type;

        /* RFC 6020 9.2.4 - range */
        if (type_p->range) {
            LY_CHECK_GOTO(rc = lys_compile_type_range(ctx, type_p->range, basetype, 0, 0,
                    base ? ((struct lysc_type_num *)base)->range : NULL, &num->range), cleanup);
            if (!tpdfname) {
                COMPILE_EXTS_GOTO(ctx, type_p->range->exts, num->range->exts, num->range, rc, cleanup);
            }
        }
        break;
    case LY_TYPE_IDENT:
        idref = (struct lysc_type_identityref *)*type;

        /* RFC 7950 9.10.2 - base */
        if (type_p->bases) {
            if (base) {
                /* only the directly derived identityrefs can contain base specification */
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid base substatement for the type \"%s\" not directly derived from identityref built-in type.",
                            tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid base substatement for the type not directly derived from identityref built-in type.");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            LY_CHECK_GOTO(rc = lys_compile_identity_bases(ctx, type_p->pmod, type_p->bases, NULL, &idref->bases), cleanup);
        } else if (base) {
            /* copy all the bases */
            const struct lysc_type_identityref *idref_base = (struct lysc_type_identityref *)base;
            LY_ARRAY_COUNT_TYPE u;

            LY_ARRAY_CREATE_GOTO(ctx->ctx, idref->bases, LY_ARRAY_COUNT(idref_base->bases), rc, cleanup);
            LY_ARRAY_FOR(idref_base->bases, u) {
                idref->bases[u] = idref_base->bases[u];
                LY_ARRAY_INCREMENT(idref->bases);
            }
        } else {
            /* type derived from identityref built-in type must contain at least one base */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "base", "identityref type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "base", "identityref type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_LEAFREF:
        lref = (struct lysc_type_leafref *)*type;

        /* RFC 7950 9.9.3 - require-instance */
        if (type_p->flags & LYS_SET_REQINST) {
            if (type_p->pmod->version < LYS_VERSION_1_1) {
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                            "Leafref type \"%s\" can be restricted by require-instance statement only in YANG 1.1 modules.", tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                            "Leafref type can be restricted by require-instance statement only in YANG 1.1 modules.");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            lref->require_instance = type_p->require_instance;
        } else if (base) {
            /* inherit */
            lref->require_instance = ((struct lysc_type_leafref *)base)->require_instance;
        } else {
            /* default is true */
            lref->require_instance = 1;
        }
        if (type_p->path) {
            LY_VALUE_FORMAT format;

            LY_CHECK_GOTO(rc = lyxp_expr_dup(ctx->ctx, type_p->path, 0, 0, &lref->path), cleanup);
            LY_CHECK_GOTO(lyplg_type_prefix_data_new(ctx->ctx, type_p->path->expr, strlen(type_p->path->expr),
                    LY_VALUE_SCHEMA, type_p->pmod, &format, (void **)&lref->prefixes), cleanup);
        } else if (base) {
            LY_CHECK_GOTO(rc = lyxp_expr_dup(ctx->ctx, ((struct lysc_type_leafref *)base)->path, 0, 0, &lref->path), cleanup);
            LY_CHECK_GOTO(rc = lyplg_type_prefix_data_dup(ctx->ctx, LY_VALUE_SCHEMA_RESOLVED,
                    ((struct lysc_type_leafref *)base)->prefixes, (void **)&lref->prefixes), cleanup);
        } else {
            /* type derived from leafref built-in type must contain path */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "path", "leafref type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "path", "leafref type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_INST:
        /* RFC 7950 9.9.3 - require-instance */
        if (type_p->flags & LYS_SET_REQINST) {
            ((struct lysc_type_instanceid *)*type)->require_instance = type_p->require_instance;
        } else {
            /* default is true */
            ((struct lysc_type_instanceid *)*type)->require_instance = 1;
        }
        break;
    case LY_TYPE_UNION:
        un = (struct lysc_type_union *)*type;

        /* RFC 7950 7.4 - type */
        if (type_p->types) {
            if (base) {
                /* only the directly derived union can contain types specification */
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid type substatement for the type \"%s\" not directly derived from union built-in type.",
                            tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid type substatement for the type not directly derived from union built-in type.");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            /* compile the type */
            LY_CHECK_GOTO(rc = lys_compile_type_union(ctx, type_p->types, context_pnode, context_flags, context_name,
                    &un->types), cleanup);
        } else if (base) {
            /* copy all the types */
            const struct lysc_type_union *un_base = (struct lysc_type_union *)base;
            LY_ARRAY_COUNT_TYPE u;

            LY_ARRAY_CREATE_GOTO(ctx->ctx, un->types, LY_ARRAY_COUNT(un_base->types), rc, cleanup);
            LY_ARRAY_FOR(un_base->types, u) {
                un->types[u] = un_base->types[u];
                LY_ATOMIC_INC_BARRIER(un->types[u]->refcount);
                LY_ARRAY_INCREMENT(un->types);
            }
        } else {
            /* type derived from union built-in type must contain at least one type */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "type", "union type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "type", "union type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_BOOL:
    case LY_TYPE_EMPTY:
    case LY_TYPE_UNKNOWN: /* just to complete switch */
        break;
    }

    if (tpdf_chain->count > tpdf_chain_last) {
        i = tpdf_chain->count;
        do {
            --i;
            tpdf_item = tpdf_chain->objs[i];

            /* compile previous typedefs extensions */
            COMPILE_EXTS_GOTO(ctx, tpdf_item->tpdf->type.exts, (*type)->exts, *type, rc, cleanup);
        } while (i > tpdf_chain_last);
    }

    /* compile new parsed extensions */
    COMPILE_EXTS_GOTO(ctx, type_p->exts, (*type)->exts, *type, rc, cleanup);

cleanup:
    if (rc) {
        LY_ATOMIC_INC_BARRIER((*type)->refcount);
        lysc_type_free(&ctx->free_ctx, *type);
        *type = NULL;
    }
    return rc;
}